

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void clipme(Terminal *term,pos top,pos bottom,_Bool rect,_Bool desel,int *clipboards,
           wchar_t n_clipboards)

{
  char acVar1 [4];
  truecolour tc_00;
  pos pVar2;
  pos p1;
  pos p2;
  bool bVar3;
  unsigned_long uVar4;
  wchar_t wVar5;
  _Bool _Var6;
  char byte;
  uint uVar7;
  termline *line;
  wchar_t local_134;
  _Bool local_11d;
  wchar_t local_11c;
  _Bool local_116;
  wchar_t local_114;
  _Bool clip_local;
  wchar_t i_1;
  wchar_t i;
  wchar_t rv;
  wchar_t wbuf [4];
  char local_f0;
  undefined1 local_ef;
  wchar_t local_ec;
  char buf_1 [4];
  wchar_t uc;
  wchar_t x;
  wchar_t c;
  wchar_t *p;
  wchar_t cbuf [16];
  pos nlpos;
  termline *ldata;
  _Bool nl;
  truecolour tc;
  wchar_t attr;
  wchar_t old_top_x;
  clip_workbuf buf;
  int *clipboards_local;
  _Bool desel_local;
  _Bool rect_local;
  Terminal *term_local;
  pos bottom_local;
  pos top_local;
  
  _attr = 0x1400;
  buf.bufsize = 0;
  buf.tcptr = (truecolour *)clipboards;
  buf.bufpos = (size_t)safemalloc(0x1400,4,0);
  buf.textbuf = (wchar_t *)buf.bufpos;
  buf.textptr = (wchar_t *)safemalloc(_attr,4,0);
  buf.attrbuf = buf.textptr;
  buf.attrptr = (wchar_t *)safemalloc(_attr,8,0);
  bottom_local.x = top.x;
  wVar5 = bottom_local.x;
  buf.tcbuf = (truecolour *)buf.attrptr;
  bottom_local = top;
  do {
    _Var6 = poslt(bottom_local,bottom);
    if (!_Var6) {
      bVar3 = false;
      for (local_114 = L'\0'; local_114 < n_clipboards; local_114 = local_114 + L'\x01') {
        if ((&(buf.tcptr)->fg)[local_114] == (optionalrgb)0x1) {
          bVar3 = true;
        }
        else if ((&(buf.tcptr)->fg)[local_114] != (optionalrgb)0x0) {
          win_clip_write(term->win,(wchar_t)(&(buf.tcptr)->fg)[local_114],(wchar_t *)buf.bufpos,
                         buf.textptr,(truecolour *)buf.attrptr,(wchar_t)buf.bufsize,desel);
        }
      }
      if (bVar3) {
        safefree(term->last_selected_text);
        safefree(term->last_selected_attr);
        safefree(term->last_selected_tc);
        term->last_selected_text = (wchar_t *)buf.bufpos;
        term->last_selected_attr = buf.textptr;
        term->last_selected_tc = (truecolour *)buf.attrptr;
        term->last_selected_len = buf.bufsize;
      }
      else {
        safefree((void *)buf.bufpos);
        safefree(buf.textptr);
        safefree(buf.attrptr);
      }
      return;
    }
    ldata._7_1_ = false;
    line = lineptr(term,bottom_local.y,L'ᤲ',L'\0');
    cbuf[0xe] = bottom_local.y;
    cbuf[0xf] = term->cols;
    if ((line->lattr & 0x10) == 0) {
      while( true ) {
        local_116 = false;
        if ((cbuf[0xf] != L'\0') &&
           (((line->chars[cbuf[0xf] + L'\xffffffff'].chr == 0x20 ||
             ((local_116 = false,
              (line->chars[cbuf[0xf] + L'\xffffffff'].chr & 0xfffffc00) == 0xd800 &&
              (local_116 = false, (line->chars[cbuf[0xf] + L'\xffffffff'].chr & 0xff) == 0x20)))) &&
            (local_116 = false, line->chars[cbuf[0xf] + L'\xffffffff'].cc_next == L'\0')))) {
          pVar2.x = cbuf[0xf];
          pVar2.y = cbuf[0xe];
          local_116 = poslt(bottom_local,pVar2);
        }
        if (local_116 == false) break;
        decpos_fn((pos *)(cbuf + 0xe),term->cols);
      }
      p1.x = cbuf[0xf];
      p1.y = cbuf[0xe];
      ldata._7_1_ = poslt(p1,bottom);
    }
    else {
      if ((line->trusted & 1U) != 0) {
        if (cbuf[0xf] < L'\x03') {
          local_11c = L'\0';
        }
        else {
          local_11c = cbuf[0xf] + L'\xfffffffd';
        }
        cbuf[0xf] = local_11c;
      }
      if ((line->lattr & 0x20) != 0) {
        decpos_fn((pos *)(cbuf + 0xe),term->cols);
      }
    }
    if (rect) {
      term_local._4_4_ = bottom.x;
      if (term_local._4_4_ < cbuf[0xf]) {
        cbuf[0xf] = term_local._4_4_;
      }
      term_local._0_4_ = bottom.y;
      ldata._7_1_ = bottom_local.y < (wchar_t)term_local;
    }
LAB_0010e398:
    while( true ) {
      pVar2 = bottom_local;
      _Var6 = poslt(bottom_local,bottom);
      local_11d = false;
      if (_Var6) {
        p2.x = cbuf[0xf];
        p2.y = cbuf[0xe];
        local_11d = poslt(bottom_local,p2);
      }
      if (local_11d == false) break;
      acVar1[0] = (undefined1)bottom_local.x;
      acVar1[1] = bottom_local.x._1_1_;
      acVar1[2] = bottom_local.x._2_1_;
      acVar1[3] = bottom_local.x._3_1_;
      buf_1[0] = (undefined1)bottom_local.x;
      buf_1[1] = bottom_local.x._1_1_;
      buf_1[2] = bottom_local.x._2_1_;
      buf_1[3] = bottom_local.x._3_1_;
      if (line->chars[bottom_local.x].chr != 0xdfff) {
        do {
          bottom_local = pVar2;
          local_ec = (wchar_t)line->chars[(int)buf_1].chr;
          uVar4 = line->chars[(int)buf_1].attr;
          tc_00 = line->chars[(int)buf_1].truecolour;
          uVar7 = local_ec & 0xffffff00;
          if (uVar7 == 0xd800) {
LAB_0010e4e7:
            local_ec = term->ucsdata->unitab_line[local_ec & 0xff];
          }
          else if (uVar7 == 0xd900) {
            if ((term->rawcnp & 1U) != 0) goto LAB_0010e4e7;
            local_ec = term->ucsdata->unitab_xterm[local_ec & 0xff];
          }
          else if (uVar7 == 0xda00) {
            local_ec = term->ucsdata->unitab_scoacs[local_ec & 0xff];
          }
          if ((local_ec & 0xffffff00U) == 0xdc00) {
            local_ec = term->ucsdata->unitab_oemcp[local_ec & 0xff];
          }
          else if ((local_ec & 0xffffff00U) == 0xdd00) {
            local_ec = term->ucsdata->unitab_font[local_ec & 0xff];
          }
          p._0_4_ = local_ec;
          p._4_4_ = 0;
          if ((((local_ec & 0xfffffe00U) == 0xdc00) && (0x1f < (uint)(local_ec & 0xffU))) &&
             ((local_ec & 0xffU) != 0x7f)) {
            byte = (char)local_ec;
            _Var6 = is_dbcs_leadbyte(term->ucsdata->font_codepage,byte);
            local_f0 = byte;
            if (_Var6) {
              local_ef = (undefined1)line->chars[bottom_local.x + L'\x01'].chr;
              i_1 = mb_to_wc(term->ucsdata->font_codepage,L'\0',&local_f0,L'\x02',&i,L'\x04');
              bottom_local.x = bottom_local.x + L'\x01';
            }
            else {
              i_1 = mb_to_wc(term->ucsdata->font_codepage,L'\0',&local_f0,L'\x01',&i,L'\x04');
            }
            if (L'\0' < i_1) {
              memcpy(&p,&i,(long)i_1 << 2);
              cbuf[(long)i_1 + -2] = L'\0';
            }
          }
          for (_x = &p; *(wchar_t *)_x != L'\0'; _x = (wchar_t **)((long)_x + 4)) {
            clip_addchar((clip_workbuf *)&attr,*(wchar_t *)_x,(wchar_t)uVar4,tc_00);
          }
          if (line->chars[(int)buf_1].cc_next == L'\0') goto LAB_0010e7bc;
          buf_1 = (char  [4])(line->chars[(int)buf_1].cc_next + (int)buf_1);
          pVar2 = bottom_local;
        } while( true );
      }
      bottom_local.x = bottom_local.x + L'\x01';
      buf_1 = acVar1;
    }
    if (ldata._7_1_ != false) {
      bVar3 = false;
      while (!bVar3) {
        clip_addchar((clip_workbuf *)&attr,L'\n',L'\0',(term->basic_erase_char).truecolour);
        bVar3 = true;
      }
    }
    if (rect) {
      local_134 = wVar5;
    }
    else {
      local_134 = L'\0';
    }
    bottom_local.x = local_134;
    bottom_local.y = bottom_local.y + L'\x01';
    unlineptr(line);
  } while( true );
LAB_0010e7bc:
  bottom_local.x = bottom_local.x + L'\x01';
  goto LAB_0010e398;
}

Assistant:

static void clipme(Terminal *term, pos top, pos bottom, bool rect, bool desel,
                   const int *clipboards, int n_clipboards)
{
    clip_workbuf buf;
    int old_top_x;
    int attr;
    truecolour tc;

    buf.bufsize = 5120;
    buf.bufpos = 0;
    buf.textptr = buf.textbuf = snewn(buf.bufsize, wchar_t);
    buf.attrptr = buf.attrbuf = snewn(buf.bufsize, int);
    buf.tcptr = buf.tcbuf = snewn(buf.bufsize, truecolour);

    old_top_x = top.x;                 /* needed for rect==1 */

    while (poslt(top, bottom)) {
        bool nl = false;
        termline *ldata = lineptr(top.y);
        pos nlpos;

        /*
         * nlpos will point at the maximum position on this line we
         * should copy up to. So we start it at the end of the
         * line...
         */
        nlpos.y = top.y;
        nlpos.x = term->cols;

        /*
         * ... move it backwards if there's unused space at the end
         * of the line (and also set `nl' if this is the case,
         * because in normal selection mode this means we need a
         * newline at the end)...
         */
        if (!(ldata->lattr & LATTR_WRAPPED)) {
            while (nlpos.x &&
                   IS_SPACE_CHR(ldata->chars[nlpos.x - 1].chr) &&
                   !ldata->chars[nlpos.x - 1].cc_next &&
                   poslt(top, nlpos))
                decpos(nlpos);
            if (poslt(nlpos, bottom))
                nl = true;
        } else {
            if (ldata->trusted) {
                /* A wrapped line with a trust sigil on it terminates
                 * a few characters earlier. */
                nlpos.x = (nlpos.x < TRUST_SIGIL_WIDTH ? 0 :
                           nlpos.x - TRUST_SIGIL_WIDTH);
            }
            if (ldata->lattr & LATTR_WRAPPED2) {
                /* Ignore the last char on the line in a WRAPPED2 line. */
                decpos(nlpos);
            }
        }

        /*
         * ... and then clip it to the terminal x coordinate if
         * we're doing rectangular selection. (In this case we
         * still did the above, so that copying e.g. the right-hand
         * column from a table doesn't fill with spaces on the
         * right.)
         */
        if (rect) {
            if (nlpos.x > bottom.x)
                nlpos.x = bottom.x;
            nl = (top.y < bottom.y);
        }

        while (poslt(top, bottom) && poslt(top, nlpos)) {
#if 0
            char cbuf[16], *p;
            sprintf(cbuf, "<U+%04x>", (ldata[top.x] & 0xFFFF));
#else
            wchar_t cbuf[16], *p;
            int c;
            int x = top.x;

            if (ldata->chars[x].chr == UCSWIDE) {
                top.x++;
                continue;
            }

            while (1) {
                int uc = ldata->chars[x].chr;
                attr = ldata->chars[x].attr;
                tc = ldata->chars[x].truecolour;

                switch (uc & CSET_MASK) {
                  case CSET_LINEDRW:
                    if (!term->rawcnp) {
                        uc = term->ucsdata->unitab_xterm[uc & 0xFF];
                        break;
                    }
                  case CSET_ASCII:
                    uc = term->ucsdata->unitab_line[uc & 0xFF];
                    break;
                  case CSET_SCOACS:
                    uc = term->ucsdata->unitab_scoacs[uc&0xFF];
                    break;
                }
                switch (uc & CSET_MASK) {
                  case CSET_ACP:
                    uc = term->ucsdata->unitab_font[uc & 0xFF];
                    break;
                  case CSET_OEMCP:
                    uc = term->ucsdata->unitab_oemcp[uc & 0xFF];
                    break;
                }

                c = (uc & ~CSET_MASK);
#ifdef PLATFORM_IS_UTF16
                if (uc > 0x10000 && uc < 0x110000) {
                    cbuf[0] = 0xD800 | ((uc - 0x10000) >> 10);
                    cbuf[1] = 0xDC00 | ((uc - 0x10000) & 0x3FF);
                    cbuf[2] = 0;
                } else
#endif
                {
                    cbuf[0] = uc;
                    cbuf[1] = 0;
                }

                if (DIRECT_FONT(uc)) {
                    if (c >= ' ' && c != 0x7F) {
                        char buf[4];
                        WCHAR wbuf[4];
                        int rv;
                        if (is_dbcs_leadbyte(term->ucsdata->font_codepage, (BYTE) c)) {
                            buf[0] = c;
                            buf[1] = (char) (0xFF & ldata->chars[top.x + 1].chr);
                            rv = mb_to_wc(term->ucsdata->font_codepage, 0, buf, 2, wbuf, 4);
                            top.x++;
                        } else {
                            buf[0] = c;
                            rv = mb_to_wc(term->ucsdata->font_codepage, 0, buf, 1, wbuf, 4);
                        }

                        if (rv > 0) {
                            memcpy(cbuf, wbuf, rv * sizeof(wchar_t));
                            cbuf[rv] = 0;
                        }
                    }
                }
#endif

                for (p = cbuf; *p; p++)
                    clip_addchar(&buf, *p, attr, tc);

                if (ldata->chars[x].cc_next)
                    x += ldata->chars[x].cc_next;
                else
                    break;
            }
            top.x++;
        }
        if (nl) {
            int i;
            for (i = 0; i < sel_nl_sz; i++)
                clip_addchar(&buf, sel_nl[i], 0, term->basic_erase_char.truecolour);
        }
        top.y++;
        top.x = rect ? old_top_x : 0;

        unlineptr(ldata);
    }
#if SELECTION_NUL_TERMINATED
    clip_addchar(&buf, 0, 0, term->basic_erase_char.truecolour);
#endif
    /* Finally, transfer all that to the clipboard(s). */
    {
        int i;
        bool clip_local = false;
        for (i = 0; i < n_clipboards; i++) {
            if (clipboards[i] == CLIP_LOCAL) {
                clip_local = true;
            } else if (clipboards[i] != CLIP_NULL) {
                win_clip_write(
                    term->win, clipboards[i], buf.textbuf, buf.attrbuf,
                    buf.tcbuf, buf.bufpos, desel);
            }
        }
        if (clip_local) {
            sfree(term->last_selected_text);
            sfree(term->last_selected_attr);
            sfree(term->last_selected_tc);
            term->last_selected_text = buf.textbuf;
            term->last_selected_attr = buf.attrbuf;
            term->last_selected_tc = buf.tcbuf;
            term->last_selected_len = buf.bufpos;
        } else {
            sfree(buf.textbuf);
            sfree(buf.attrbuf);
            sfree(buf.tcbuf);
        }
    }
}